

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O1

size_t ZSTD_DUBT_findBestMatch
                 (ZSTD_matchState_t *ms,BYTE *ip,BYTE *iend,size_t *offsetPtr,U32 mls,
                 ZSTD_dictMode_e dictMode)

{
  ulong *puVar1;
  ulong *puVar2;
  BYTE *pBVar3;
  BYTE *pBVar4;
  ZSTD_matchState_t *pZVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  size_t sVar9;
  byte *pbVar10;
  BYTE *pBVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  char cVar15;
  uint uVar16;
  int iVar17;
  U32 *pUVar18;
  uint *puVar19;
  uint uVar20;
  ulong *puVar21;
  ulong *puVar22;
  uint uVar23;
  int iVar24;
  uint uVar25;
  uint uVar26;
  ulong *puVar27;
  ulong *puVar28;
  uint uVar29;
  uint uVar30;
  byte *pbVar31;
  uint uVar32;
  int iVar33;
  BYTE *pBVar34;
  ulong uVar35;
  U32 UVar36;
  uint uVar37;
  byte *pbVar38;
  ulong *puVar39;
  U32 UVar40;
  BYTE *pBVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  long lVar45;
  U32 *pUVar46;
  bool bVar47;
  BYTE *pInLoopLimit;
  U32 dummy32;
  U32 *local_138;
  ulong local_130;
  byte *local_120;
  byte *local_118;
  ulong local_110;
  uint *local_f8;
  U32 *local_d8;
  uint local_78;
  U32 local_74;
  U32 *local_70;
  ulong local_68;
  ulong local_60;
  U32 *local_58;
  BYTE *local_50;
  BYTE *local_48;
  ulong *local_40;
  ulong *local_38;
  
  local_58 = ms->hashTable;
  local_68 = (ulong)(mls - 5);
  cVar15 = (char)(ms->cParams).hashLog;
  switch(local_68) {
  case 0:
    lVar45 = -0x30e4432345000000;
    break;
  case 1:
    lVar45 = -0x30e4432340650000;
    break;
  case 2:
    lVar45 = -0x30e44323405a9d00;
    break;
  case 3:
    local_60 = *(long *)ip * -0x30e44323485a9b9d;
    goto LAB_0020bf7d;
  default:
    local_60 = (ulong)((uint)(*(int *)ip * -0x61c8864f) >> (-cVar15 & 0x1fU));
    goto LAB_0020bf82;
  }
  local_60 = lVar45 * *(long *)ip;
LAB_0020bf7d:
  local_60 = local_60 >> (-cVar15 & 0x3fU);
LAB_0020bf82:
  pBVar3 = (ms->window).base;
  uVar29 = (int)ip - (int)pBVar3;
  uVar7 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  UVar40 = (ms->window).lowLimit;
  UVar36 = uVar29 - uVar7;
  if (uVar29 - UVar40 <= uVar7) {
    UVar36 = UVar40;
  }
  if (ms->loadedDictEnd != 0) {
    UVar36 = UVar40;
  }
  uVar7 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
  uVar8 = 0;
  uVar16 = uVar29 - uVar7;
  if (uVar29 < uVar7) {
    uVar16 = 0;
  }
  uVar44 = UVar36;
  if (UVar36 < uVar16) {
    uVar44 = uVar16;
  }
  uVar32 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
  pUVar46 = ms->chainTable;
  uVar42 = uVar32;
  if (uVar44 < local_58[local_60]) {
    uVar37 = local_58[local_60];
    uVar26 = 0;
    do {
      uVar20 = uVar37;
      uVar8 = (ulong)uVar20;
      uVar35 = (ulong)((uVar20 & uVar7) * 2);
      if ((pUVar46[uVar35 + 1] != 1) || (uVar42 < 2)) {
        if (pUVar46[uVar35 + 1] == 1) {
          (pUVar46 + uVar35)[0] = 0;
          (pUVar46 + uVar35)[1] = 0;
        }
        uVar8 = (ulong)uVar26;
        break;
      }
      pUVar46[uVar35 + 1] = uVar26;
      uVar42 = uVar42 - 1;
      uVar37 = pUVar46[uVar35];
      uVar26 = uVar20;
    } while (uVar44 < pUVar46[uVar35]);
  }
  local_70 = pUVar46;
  if ((int)uVar8 != 0) {
    pBVar4 = (ms->window).dictBase;
    do {
      uVar23 = (uint)uVar8;
      uVar37 = pUVar46[(ulong)((uVar23 & uVar7) * 2) + 1];
      uVar20 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
      uVar26 = (ms->window).dictLimit;
      pbVar31 = (byte *)(ulong)uVar26;
      local_38 = (ulong *)(pBVar4 + (long)pbVar31);
      puVar39 = (ulong *)iend;
      pBVar34 = pBVar3;
      if (uVar23 < uVar26) {
        puVar39 = local_38;
        pBVar34 = pBVar4;
      }
      pBVar34 = pBVar34 + uVar8;
      local_48 = pBVar3 + (long)pbVar31;
      uVar8 = (ulong)((uVar23 & uVar20) * 2);
      local_138 = pUVar46 + uVar8;
      uVar43 = (ms->window).lowLimit;
      uVar25 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
      uVar30 = uVar23 - uVar25;
      if (uVar23 - uVar43 <= uVar25) {
        uVar30 = uVar43;
      }
      local_d8 = pUVar46 + uVar8 + 1;
      UVar40 = local_d8[-1];
      puVar22 = (ulong *)((long)puVar39 - 7);
      puVar28 = (ulong *)((long)puVar39 - 3);
      puVar1 = (ulong *)((long)puVar39 - 1);
      local_118 = (byte *)0x0;
      local_120 = (byte *)0x0;
      uVar43 = uVar42;
      local_50 = pBVar34;
      local_40 = puVar39;
      do {
        bVar47 = uVar43 == 0;
        uVar43 = uVar43 - 1;
        if ((bVar47) || (UVar40 <= uVar30)) break;
        pbVar10 = local_118;
        if (local_120 < local_118) {
          pbVar10 = local_120;
        }
        pBVar11 = pBVar3;
        if (dictMode == ZSTD_extDict) {
          if ((uVar23 < uVar26) || (pbVar31 <= pbVar10 + UVar40)) {
            if (pbVar10 + UVar40 < pbVar31) {
              pBVar11 = pBVar4;
            }
            goto LAB_0020c265;
          }
          sVar9 = ZSTD_count_2segments
                            (pBVar34 + (long)pbVar10,pBVar4 + UVar40 + (long)pbVar10,(BYTE *)puVar39
                             ,(BYTE *)local_38,local_48);
          pbVar10 = pbVar10 + sVar9;
          pBVar11 = pBVar3 + UVar40;
          pBVar34 = local_50;
          puVar39 = local_40;
          pUVar46 = local_70;
          if (pbVar10 + UVar40 < pbVar31) {
            pBVar11 = pBVar4 + UVar40;
          }
        }
        else {
LAB_0020c265:
          puVar2 = (ulong *)(pBVar34 + (long)pbVar10);
          puVar21 = (ulong *)(pBVar11 + UVar40 + (long)pbVar10);
          puVar27 = puVar2;
          if (puVar2 < puVar22) {
            uVar35 = *puVar2 ^ *puVar21;
            uVar8 = 0;
            if (uVar35 != 0) {
              for (; (uVar35 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
              }
            }
            pbVar38 = (byte *)(uVar8 >> 3 & 0x1fffffff);
            if (*puVar21 == *puVar2) {
              do {
                puVar27 = puVar27 + 1;
                puVar21 = puVar21 + 1;
                if (puVar22 <= puVar27) goto LAB_0020c2d9;
                uVar35 = *puVar27 ^ *puVar21;
                uVar8 = 0;
                if (uVar35 != 0) {
                  for (; (uVar35 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
                  }
                }
                pbVar38 = (byte *)((long)puVar27 + ((uVar8 >> 3 & 0x1fffffff) - (long)puVar2));
              } while (*puVar21 == *puVar27);
            }
          }
          else {
LAB_0020c2d9:
            if ((puVar27 < puVar28) && ((int)*puVar21 == (int)*puVar27)) {
              puVar27 = (ulong *)((long)puVar27 + 4);
              puVar21 = (ulong *)((long)puVar21 + 4);
            }
            if ((puVar27 < puVar1) && ((short)*puVar21 == (short)*puVar27)) {
              puVar27 = (ulong *)((long)puVar27 + 2);
              puVar21 = (ulong *)((long)puVar21 + 2);
            }
            if (puVar27 < puVar39) {
              puVar27 = (ulong *)((long)puVar27 + (ulong)((byte)*puVar21 == (byte)*puVar27));
            }
            pbVar38 = (byte *)((long)puVar27 - (long)puVar2);
          }
          pbVar10 = pbVar38 + (long)pbVar10;
          pBVar11 = pBVar11 + UVar40;
        }
        if ((ulong *)(pBVar34 + (long)pbVar10) == puVar39) {
          bVar47 = false;
        }
        else {
          pUVar18 = pUVar46 + (UVar40 & uVar20) * 2;
          if (pBVar11[(long)pbVar10] < (byte)*(ulong *)(pBVar34 + (long)pbVar10)) {
            *local_138 = UVar40;
            local_120 = pbVar10;
            if (uVar44 < UVar40) {
              pUVar18 = pUVar18 + 1;
              local_138 = pUVar18;
LAB_0020c37b:
              UVar40 = *pUVar18;
              bVar47 = true;
            }
            else {
              bVar47 = false;
              local_138 = &local_74;
            }
          }
          else {
            *local_d8 = UVar40;
            local_118 = pbVar10;
            local_d8 = pUVar18;
            if (uVar44 < UVar40) goto LAB_0020c37b;
            bVar47 = false;
            local_d8 = &local_74;
          }
        }
      } while (bVar47);
      *local_d8 = 0;
      *local_138 = 0;
      uVar42 = uVar42 + 1;
      uVar8 = (ulong)uVar37;
    } while (uVar37 != 0);
  }
  pBVar4 = (ms->window).dictBase;
  uVar35 = (ulong)(ms->window).dictLimit;
  uVar8 = (ulong)((uVar7 & uVar29) * 2);
  local_f8 = pUVar46 + uVar8;
  local_138 = pUVar46 + uVar8 + 1;
  iVar24 = uVar29 + 9;
  uVar14 = (ulong)local_58[local_60];
  local_58[local_60] = uVar29;
  local_118 = (byte *)0x0;
  local_120 = (byte *)0x0;
  uVar8 = 0;
  do {
    bVar47 = uVar32 == 0;
    uVar32 = uVar32 - 1;
    if ((bVar47) || (uVar44 = (uint)uVar14, uVar44 <= UVar36)) break;
    pbVar31 = local_120;
    if (local_118 < local_120) {
      pbVar31 = local_118;
    }
    if ((dictMode == ZSTD_extDict) && ((long)pbVar31 + uVar14 < uVar35)) {
      pBVar11 = pBVar4 + uVar14;
      sVar9 = ZSTD_count_2segments
                        (ip + (long)pbVar31,pBVar11 + (long)pbVar31,iend,pBVar4 + uVar35,
                         pBVar3 + uVar35);
      uVar12 = sVar9 + (long)pbVar31;
      pBVar34 = pBVar3 + uVar14;
      if (uVar12 + uVar14 < uVar35) {
        pBVar34 = pBVar11;
      }
    }
    else {
      puVar39 = (ulong *)(ip + (long)pbVar31);
      puVar22 = (ulong *)(pBVar3 + uVar14 + (long)pbVar31);
      puVar28 = puVar39;
      if (puVar39 < iend + -7) {
        uVar13 = *puVar39 ^ *puVar22;
        uVar12 = 0;
        if (uVar13 != 0) {
          for (; (uVar13 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
          }
        }
        uVar12 = uVar12 >> 3 & 0x1fffffff;
        if (*puVar22 == *puVar39) {
          do {
            puVar28 = puVar28 + 1;
            puVar22 = puVar22 + 1;
            if (iend + -7 <= puVar28) goto LAB_0020c5bc;
            uVar13 = *puVar28 ^ *puVar22;
            uVar12 = 0;
            if (uVar13 != 0) {
              for (; (uVar13 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
              }
            }
            uVar12 = (long)puVar28 + ((uVar12 >> 3 & 0x1fffffff) - (long)puVar39);
          } while (*puVar22 == *puVar28);
        }
      }
      else {
LAB_0020c5bc:
        if ((puVar28 < iend + -3) && ((int)*puVar22 == (int)*puVar28)) {
          puVar28 = (ulong *)((long)puVar28 + 4);
          puVar22 = (ulong *)((long)puVar22 + 4);
        }
        if ((puVar28 < iend + -1) && ((short)*puVar22 == (short)*puVar28)) {
          puVar28 = (ulong *)((long)puVar28 + 2);
          puVar22 = (ulong *)((long)puVar22 + 2);
        }
        if (puVar28 < iend) {
          puVar28 = (ulong *)((long)puVar28 + (ulong)((char)*puVar22 == (char)*puVar28));
        }
        uVar12 = (long)puVar28 - (long)puVar39;
      }
      uVar12 = uVar12 + (long)pbVar31;
      pBVar34 = pBVar3 + uVar14;
    }
    if (uVar8 < uVar12) {
      iVar33 = uVar44 + (int)uVar12;
      if (uVar12 <= iVar24 - uVar44) {
        iVar33 = iVar24;
      }
      uVar42 = (uVar29 + 1) - uVar44;
      iVar24 = 0x1f;
      if (uVar42 != 0) {
        for (; uVar42 >> iVar24 == 0; iVar24 = iVar24 + -1) {
        }
      }
      uVar42 = (int)*offsetPtr + 1;
      iVar17 = 0x1f;
      if (uVar42 != 0) {
        for (; uVar42 >> iVar17 == 0; iVar17 = iVar17 + -1) {
        }
      }
      if (iVar24 - iVar17 < ((int)uVar12 - (int)uVar8) * 4) {
        *offsetPtr = (ulong)((uVar29 + 2) - uVar44);
        uVar8 = uVar12;
      }
      iVar24 = iVar33;
      if (ip + uVar12 != iend) goto LAB_0020c688;
      bVar47 = false;
      if (dictMode == ZSTD_dictMatchState) {
        uVar32 = 0;
      }
    }
    else {
LAB_0020c688:
      puVar19 = local_70 + (uVar44 & uVar7) * 2;
      if (pBVar34[uVar12] < ip[uVar12]) {
        *local_f8 = uVar44;
        local_118 = (byte *)uVar12;
        if (uVar16 < uVar44) {
          puVar19 = puVar19 + 1;
          local_f8 = puVar19;
LAB_0020c6da:
          uVar14 = (ulong)*puVar19;
          bVar47 = true;
        }
        else {
          bVar47 = false;
          local_f8 = &local_78;
        }
      }
      else {
        *local_138 = uVar44;
        local_138 = puVar19;
        local_120 = (byte *)uVar12;
        if (uVar16 < uVar44) goto LAB_0020c6da;
        bVar47 = false;
        local_138 = &local_78;
      }
    }
  } while (bVar47);
  *local_138 = 0;
  *local_f8 = 0;
  if ((dictMode == ZSTD_dictMatchState) && (uVar32 != 0)) {
    pZVar5 = ms->dictMatchState;
    if ((uint)local_68 < 4) {
      sVar9 = (*(code *)(&DAT_002814bc + *(int *)(&DAT_002814bc + local_68 * 4)))
                        (&DAT_002814bc + *(int *)(&DAT_002814bc + local_68 * 4));
      return sVar9;
    }
    UVar40 = pZVar5->hashTable
             [(uint)(*(int *)ip * -0x61c8864f) >> (-(char)(pZVar5->cParams).hashLog & 0x1fU)];
    uVar7 = (ms->window).dictLimit;
    pBVar4 = (pZVar5->window).nextSrc;
    pBVar34 = (pZVar5->window).base;
    uVar35 = (long)pBVar4 - (long)pBVar34;
    uVar16 = (pZVar5->window).lowLimit;
    iVar33 = (int)uVar35;
    uVar42 = (ms->window).lowLimit - iVar33;
    uVar37 = ~(-1 << ((char)(pZVar5->cParams).chainLog - 1U & 0x1f));
    uVar44 = iVar33 - uVar37;
    if (iVar33 - uVar16 <= uVar37) {
      uVar44 = uVar16;
    }
    pUVar46 = pZVar5->chainTable;
    local_130 = 0;
    local_110 = 0;
    do {
      bVar47 = uVar32 == 0;
      uVar32 = uVar32 - 1;
      if ((bVar47) || (UVar40 <= uVar16)) break;
      uVar14 = local_110;
      if (local_130 < local_110) {
        uVar14 = local_130;
      }
      uVar12 = (ulong)UVar40;
      pBVar11 = pBVar34 + uVar12;
      sVar9 = ZSTD_count_2segments(ip + uVar14,pBVar11 + uVar14,iend,pBVar4,pBVar3 + uVar7);
      uVar14 = sVar9 + uVar14;
      pBVar41 = pBVar3 + uVar12 + uVar42;
      if (uVar14 + uVar12 < (uVar35 & 0xffffffff)) {
        pBVar41 = pBVar11;
      }
      if (uVar8 < uVar14) {
        iVar17 = uVar42 + UVar40;
        uVar26 = (uVar29 + 1) - iVar17;
        iVar33 = 0x1f;
        if (uVar26 != 0) {
          for (; uVar26 >> iVar33 == 0; iVar33 = iVar33 + -1) {
          }
        }
        uVar26 = (int)*offsetPtr + 1;
        iVar6 = 0x1f;
        if (uVar26 != 0) {
          for (; uVar26 >> iVar6 == 0; iVar6 = iVar6 + -1) {
          }
        }
        if (iVar33 - iVar6 < ((int)uVar14 - (int)uVar8) * 4) {
          *offsetPtr = (ulong)((uVar29 + 2) - iVar17);
          uVar8 = uVar14;
        }
        if (ip + uVar14 != iend) goto LAB_0020c966;
        cVar15 = (ip + uVar14 == iend) * '\x03';
      }
      else {
LAB_0020c966:
        pUVar18 = pUVar46 + (UVar40 & uVar37) * 2;
        if (pBVar41[uVar14] < ip[uVar14]) {
          cVar15 = '\x03';
          if (uVar44 < UVar40) {
            pUVar18 = pUVar18 + 1;
            uVar12 = local_110;
            local_130 = uVar14;
LAB_0020c9ac:
            UVar40 = *pUVar18;
            cVar15 = '\0';
            local_110 = uVar12;
          }
        }
        else {
          cVar15 = '\x03';
          uVar12 = uVar14;
          if (uVar44 < UVar40) goto LAB_0020c9ac;
        }
      }
    } while (cVar15 == '\0');
  }
  ms->nextToUpdate = iVar24 - 8;
  return uVar8;
}

Assistant:

static size_t
ZSTD_DUBT_findBestMatch(ZSTD_matchState_t* ms,
                        const BYTE* const ip, const BYTE* const iend,
                        size_t* offsetPtr,
                        U32 const mls,
                        const ZSTD_dictMode_e dictMode)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32*   const hashTable = ms->hashTable;
    U32    const hashLog = cParams->hashLog;
    size_t const h  = ZSTD_hashPtr(ip, hashLog, mls);
    U32          matchIndex  = hashTable[h];

    const BYTE* const base = ms->window.base;
    U32    const curr = (U32)(ip-base);
    U32    const windowLow = ZSTD_getLowestMatchIndex(ms, curr, cParams->windowLog);

    U32*   const bt = ms->chainTable;
    U32    const btLog  = cParams->chainLog - 1;
    U32    const btMask = (1 << btLog) - 1;
    U32    const btLow = (btMask >= curr) ? 0 : curr - btMask;
    U32    const unsortLimit = MAX(btLow, windowLow);

    U32*         nextCandidate = bt + 2*(matchIndex&btMask);
    U32*         unsortedMark = bt + 2*(matchIndex&btMask) + 1;
    U32          nbCompares = 1U << cParams->searchLog;
    U32          nbCandidates = nbCompares;
    U32          previousCandidate = 0;

    DEBUGLOG(7, "ZSTD_DUBT_findBestMatch (%u) ", curr);
    assert(ip <= iend-8);   /* required for h calculation */
    assert(dictMode != ZSTD_dedicatedDictSearch);

    /* reach end of unsorted candidates list */
    while ( (matchIndex > unsortLimit)
         && (*unsortedMark == ZSTD_DUBT_UNSORTED_MARK)
         && (nbCandidates > 1) ) {
        DEBUGLOG(8, "ZSTD_DUBT_findBestMatch: candidate %u is unsorted",
                    matchIndex);
        *unsortedMark = previousCandidate;  /* the unsortedMark becomes a reversed chain, to move up back to original position */
        previousCandidate = matchIndex;
        matchIndex = *nextCandidate;
        nextCandidate = bt + 2*(matchIndex&btMask);
        unsortedMark = bt + 2*(matchIndex&btMask) + 1;
        nbCandidates --;
    }

    /* nullify last candidate if it's still unsorted
     * simplification, detrimental to compression ratio, beneficial for speed */
    if ( (matchIndex > unsortLimit)
      && (*unsortedMark==ZSTD_DUBT_UNSORTED_MARK) ) {
        DEBUGLOG(7, "ZSTD_DUBT_findBestMatch: nullify last unsorted candidate %u",
                    matchIndex);
        *nextCandidate = *unsortedMark = 0;
    }

    /* batch sort stacked candidates */
    matchIndex = previousCandidate;
    while (matchIndex) {  /* will end on matchIndex == 0 */
        U32* const nextCandidateIdxPtr = bt + 2*(matchIndex&btMask) + 1;
        U32 const nextCandidateIdx = *nextCandidateIdxPtr;
        ZSTD_insertDUBT1(ms, matchIndex, iend,
                         nbCandidates, unsortLimit, dictMode);
        matchIndex = nextCandidateIdx;
        nbCandidates++;
    }

    /* find longest match */
    {   size_t commonLengthSmaller = 0, commonLengthLarger = 0;
        const BYTE* const dictBase = ms->window.dictBase;
        const U32 dictLimit = ms->window.dictLimit;
        const BYTE* const dictEnd = dictBase + dictLimit;
        const BYTE* const prefixStart = base + dictLimit;
        U32* smallerPtr = bt + 2*(curr&btMask);
        U32* largerPtr  = bt + 2*(curr&btMask) + 1;
        U32 matchEndIdx = curr + 8 + 1;
        U32 dummy32;   /* to be nullified at the end */
        size_t bestLength = 0;

        matchIndex  = hashTable[h];
        hashTable[h] = curr;   /* Update Hash Table */

        while (nbCompares-- && (matchIndex > windowLow)) {
            U32* const nextPtr = bt + 2*(matchIndex & btMask);
            size_t matchLength = MIN(commonLengthSmaller, commonLengthLarger);   /* guaranteed minimum nb of common bytes */
            const BYTE* match;

            if ((dictMode != ZSTD_extDict) || (matchIndex+matchLength >= dictLimit)) {
                match = base + matchIndex;
                matchLength += ZSTD_count(ip+matchLength, match+matchLength, iend);
            } else {
                match = dictBase + matchIndex;
                matchLength += ZSTD_count_2segments(ip+matchLength, match+matchLength, iend, dictEnd, prefixStart);
                if (matchIndex+matchLength >= dictLimit)
                    match = base + matchIndex;   /* to prepare for next usage of match[matchLength] */
            }

            if (matchLength > bestLength) {
                if (matchLength > matchEndIdx - matchIndex)
                    matchEndIdx = matchIndex + (U32)matchLength;
                if ( (4*(int)(matchLength-bestLength)) > (int)(ZSTD_highbit32(curr-matchIndex+1) - ZSTD_highbit32((U32)offsetPtr[0]+1)) )
                    bestLength = matchLength, *offsetPtr = ZSTD_REP_MOVE + curr - matchIndex;
                if (ip+matchLength == iend) {   /* equal : no way to know if inf or sup */
                    if (dictMode == ZSTD_dictMatchState) {
                        nbCompares = 0; /* in addition to avoiding checking any
                                         * further in this loop, make sure we
                                         * skip checking in the dictionary. */
                    }
                    break;   /* drop, to guarantee consistency (miss a little bit of compression) */
                }
            }

            if (match[matchLength] < ip[matchLength]) {
                /* match is smaller than current */
                *smallerPtr = matchIndex;             /* update smaller idx */
                commonLengthSmaller = matchLength;    /* all smaller will now have at least this guaranteed common length */
                if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
                smallerPtr = nextPtr+1;               /* new "smaller" => larger of match */
                matchIndex = nextPtr[1];              /* new matchIndex larger than previous (closer to current) */
            } else {
                /* match is larger than current */
                *largerPtr = matchIndex;
                commonLengthLarger = matchLength;
                if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
                largerPtr = nextPtr;
                matchIndex = nextPtr[0];
        }   }

        *smallerPtr = *largerPtr = 0;

        if (dictMode == ZSTD_dictMatchState && nbCompares) {
            bestLength = ZSTD_DUBT_findBetterDictMatch(
                    ms, ip, iend,
                    offsetPtr, bestLength, nbCompares,
                    mls, dictMode);
        }

        assert(matchEndIdx > curr+8); /* ensure nextToUpdate is increased */
        ms->nextToUpdate = matchEndIdx - 8;   /* skip repetitive patterns */
        if (bestLength >= MINMATCH) {
            U32 const mIndex = curr - ((U32)*offsetPtr - ZSTD_REP_MOVE); (void)mIndex;
            DEBUGLOG(8, "ZSTD_DUBT_findBestMatch(%u) : found match of length %u and offsetCode %u (pos %u)",
                        curr, (U32)bestLength, (U32)*offsetPtr, mIndex);
        }
        return bestLength;
    }
}